

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_bogus_name(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  Am_Drawonable *font_win;
  Am_Font local_20 [4];
  int i;
  Am_Font bogus_font;
  int ar_len_local;
  wins *wins_ar_local;
  
  Am_Font::Am_Font(local_20,"*-Bogus-Font-*");
  for (font_win._4_4_ = 0; font_win._4_4_ < ar_len; font_win._4_4_ = font_win._4_4_ + 1) {
    pAVar1 = wins_ar[font_win._4_4_].font_win;
    (**(code **)(*(long *)pAVar1 + 0x170))
              (pAVar1,&black,"This is Bogus",0xd,local_20,0x50,0x14,0,&Am_No_Style,0);
    (**(code **)(*(long *)pAVar1 + 0xa0))();
  }
  Am_Font::~Am_Font(local_20);
  return;
}

Assistant:

void
test_bogus_name(wins *wins_ar, int ar_len)
{
  Am_Font bogus_font("*-Bogus-Font-*");
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "This is Bogus", 13, bogus_font, 80, 20);
    font_win->Flush_Output();
  }
}